

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

int __thiscall
google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(CodedInputStream *this)

{
  byte bVar1;
  byte *pbVar2;
  uint uVar3;
  LogMessage *other;
  byte *pbVar4;
  int offset;
  long lVar5;
  ulong uVar6;
  long lVar7;
  pair<unsigned_long,_bool> pVar8;
  LogMessage local_60;
  LogFinisher local_21;
  
  pbVar2 = this->buffer_;
  pbVar4 = this->buffer_end_;
  if (((int)pbVar4 - (int)pbVar2 < 10) && ((pbVar4 <= pbVar2 || ((char)pbVar4[-1] < '\0')))) {
    pVar8 = ReadVarint64Fallback(this);
    uVar3 = 0xffffffff;
    if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar3 = -(uint)(pVar8.first >> 0x1f != 0) | (uint)pVar8.first;
    }
  }
  else {
    if (-1 < (char)*pbVar2) {
      internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/io/coded_stream.cc"
                 ,0x1a1);
      other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (buffer[0]) >= (128): ");
      internal::LogFinisher::operator=(&local_21,other);
      internal::LogMessage::~LogMessage(&local_60);
    }
    bVar1 = pbVar2[1];
    if ((long)(char)bVar1 < 0) {
      if ((long)(char)pbVar2[2] < 0) {
        if ((long)(char)pbVar2[3] < 0) {
          if ((long)(char)pbVar2[4] < 0) {
            if ((long)(char)pbVar2[5] < 0) {
              if ((long)(char)pbVar2[6] < 0) {
                if ((long)(char)pbVar2[7] < 0) {
                  if ((long)(char)pbVar2[8] < 0) {
                    if ((long)(char)pbVar2[9] < 0) {
                      return -1;
                    }
                    uVar6 = (long)(char)pbVar2[9] << 0x3f;
                    lVar5 = 0;
                    pbVar4 = pbVar2;
                    do {
                      uVar6 = uVar6 + ((ulong)*pbVar4 - 0x80 << ((byte)lVar5 & 0x3f));
                      lVar5 = lVar5 + 7;
                      pbVar4 = pbVar4 + 1;
                      lVar7 = 10;
                    } while (lVar5 != 0x3f);
                  }
                  else {
                    uVar6 = (long)(char)pbVar2[8] << 0x38;
                    lVar5 = 0;
                    pbVar4 = pbVar2;
                    do {
                      uVar6 = uVar6 + ((ulong)*pbVar4 - 0x80 << ((byte)lVar5 & 0x3f));
                      lVar5 = lVar5 + 7;
                      pbVar4 = pbVar4 + 1;
                      lVar7 = 9;
                    } while (lVar5 != 0x38);
                  }
                }
                else {
                  uVar6 = (long)(char)pbVar2[7] << 0x31;
                  lVar5 = 0;
                  pbVar4 = pbVar2;
                  do {
                    uVar6 = uVar6 + ((ulong)*pbVar4 - 0x80 << ((byte)lVar5 & 0x3f));
                    lVar5 = lVar5 + 7;
                    pbVar4 = pbVar4 + 1;
                    lVar7 = 8;
                  } while (lVar5 != 0x31);
                }
              }
              else {
                uVar6 = (long)(char)pbVar2[6] << 0x2a;
                lVar5 = 0;
                pbVar4 = pbVar2;
                do {
                  uVar6 = uVar6 + ((ulong)*pbVar4 - 0x80 << ((byte)lVar5 & 0x3f));
                  lVar5 = lVar5 + 7;
                  pbVar4 = pbVar4 + 1;
                  lVar7 = 7;
                } while (lVar5 != 0x2a);
              }
            }
            else {
              uVar6 = (long)(char)pbVar2[5] << 0x23;
              lVar5 = 0;
              pbVar4 = pbVar2;
              do {
                uVar6 = uVar6 + ((ulong)*pbVar4 - 0x80 << ((byte)lVar5 & 0x3f));
                lVar5 = lVar5 + 7;
                pbVar4 = pbVar4 + 1;
                lVar7 = 6;
              } while (lVar5 != 0x23);
            }
          }
          else {
            uVar6 = (long)(char)pbVar2[4] << 0x1c;
            lVar5 = 0;
            pbVar4 = pbVar2;
            do {
              uVar6 = uVar6 + ((ulong)*pbVar4 - 0x80 << ((byte)lVar5 & 0x3f));
              lVar5 = lVar5 + 7;
              pbVar4 = pbVar4 + 1;
            } while (lVar5 != 0x1c);
            lVar7 = 5;
          }
        }
        else {
          uVar6 = (long)(char)pbVar2[3] << 0x15;
          lVar5 = 0;
          pbVar4 = pbVar2;
          do {
            uVar6 = uVar6 + ((ulong)*pbVar4 - 0x80 << ((byte)lVar5 & 0x3f));
            lVar5 = lVar5 + 7;
            pbVar4 = pbVar4 + 1;
          } while (lVar5 != 0x15);
          lVar7 = 4;
        }
      }
      else {
        uVar6 = ((ulong)*pbVar2 + (ulong)bVar1 * 0x80 + (long)(char)pbVar2[2] * 0x4000) - 0x4080;
        lVar7 = 3;
      }
    }
    else {
      uVar6 = ((long)(char)bVar1 * 0x80 + (ulong)*pbVar2) - 0x80;
      lVar7 = 2;
    }
    uVar3 = 0xffffffff;
    if (uVar6 < 0x80000000) {
      this->buffer_ = pbVar2 + lVar7;
      uVar3 = (uint)uVar6;
    }
  }
  return uVar3;
}

Assistant:

int CodedInputStream::ReadVarintSizeAsIntFallback() {
  if (BufferSize() >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buffer_end_ > buffer_ && !(buffer_end_[-1] & 0x80))) {
    uint64 temp;
    ::std::pair<bool, const uint8*> p = ReadVarint64FromArray(buffer_, &temp);
    if (!p.first || temp > static_cast<uint64>(INT_MAX)) return -1;
    buffer_ = p.second;
    return temp;
  } else {
    // Really slow case: we will incur the cost of an extra function call here,
    // but moving this out of line reduces the size of this function, which
    // improves the common case. In micro benchmarks, this is worth about 10-15%
    return ReadVarintSizeAsIntSlow();
  }
}